

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

Tensor * __thiscall cnn::Tensor::batch_elem(Tensor *this,uint b)

{
  uint uVar1;
  uint in_EDX;
  Dim *in_RSI;
  Tensor *in_RDI;
  Dim new_d;
  uint bsize;
  Tensor *ret;
  Tensor *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Tensor *this_00;
  undefined1 local_3c [32];
  undefined4 local_1c;
  uint local_18;
  uint local_14;
  
  this_00 = in_RDI;
  local_14 = in_EDX;
  uVar1 = Dim::batch_elems(in_RSI);
  if (uVar1 == 1) {
    Tensor((Tensor *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
           in_stack_ffffffffffffff98);
  }
  else {
    uVar1 = Dim::batch_elems(in_RSI);
    if (uVar1 <= local_14) {
      __assert_fail("b < d.batch_elems()",
                    "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/tensor.h"
                    ,0x6c,"Tensor cnn::Tensor::batch_elem(unsigned int) const");
    }
    local_18 = Dim::batch_size(in_RSI);
    memcpy(local_3c,in_RSI,0x24);
    local_1c = 1;
    Tensor(this_00,&in_RDI->d,(float *)CONCAT44(local_14,in_stack_ffffffffffffffa0));
  }
  return this_00;
}

Assistant:

Tensor batch_elem(unsigned b) const {
    if(d.batch_elems() == 1) {
      return *this;
    } else {
      assert(b < d.batch_elems());
      const unsigned bsize = d.batch_size();
      Dim new_d(d); new_d.bd = 1;
      Tensor ret(new_d, v + bsize * b);
      // std::cerr << "Getting tensor for batch " << (b % d.batch_elems()) << " bsize: " << bsize << ", ptr=" << (long)ret.v << std::endl;
      return ret;
    }
  }